

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O2

void CreateBackwardReferencesNH5
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ushort uVar4;
  int iVar5;
  uint32_t uVar6;
  size_t sVar7;
  size_t sVar8;
  BrotliEncoderDictionary *pBVar9;
  uint16_t *puVar10;
  uint32_t *puVar11;
  HasherCommon *pHVar12;
  uint8_t *puVar13;
  BrotliDictionary *pBVar14;
  undefined8 uVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  ulong *puVar20;
  ulong uVar21;
  ulong uVar22;
  byte bVar23;
  size_t sVar24;
  ulong uVar25;
  ulong *puVar26;
  long lVar27;
  ulong uVar28;
  uint uVar29;
  uint32_t uVar30;
  uint uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong *puVar39;
  uint16_t uVar40;
  uint uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  int iVar47;
  long lVar48;
  long lVar49;
  int iVar50;
  ulong uVar51;
  ulong local_180;
  ulong local_178;
  ulong local_168;
  ulong local_148;
  ulong local_130;
  ulong local_128;
  int local_f0;
  uint local_ec;
  ulong local_e8;
  Command *local_c0;
  ulong local_b8;
  ulong local_a0;
  int last_distance;
  uint8_t *s1_orig_1;
  uint8_t *s1_orig;
  uint16_t *num;
  uint32_t *buckets;
  
  iVar47 = params->lgwin;
  uVar2 = (position - 3) + num_bytes;
  sVar24 = position;
  if (3 < num_bytes) {
    sVar24 = uVar2;
  }
  lVar48 = 0x200;
  if (params->quality < 9) {
    lVar48 = 0x40;
  }
  sVar7 = params->stream_offset;
  uVar1 = position + num_bytes;
  uVar37 = *last_insert_len;
  sVar8 = (params->dictionary).compound.total_size;
  uVar17 = *(uint *)((long)&(hasher->privat)._H35.hb.table + 4);
  if (4 < (int)uVar17) {
    iVar5 = *dist_cache;
    dist_cache[4] = iVar5 + -1;
    dist_cache[5] = iVar5 + 1;
    dist_cache[6] = iVar5 + -2;
    dist_cache[7] = iVar5 + 2;
    *(ulong *)(dist_cache + 8) = CONCAT44(iVar5 + 3,iVar5 + -3);
    if (10 < uVar17) {
      iVar5 = dist_cache[1];
      dist_cache[10] = iVar5 + -1;
      dist_cache[0xb] = iVar5 + 1;
      dist_cache[0xc] = iVar5 + -2;
      dist_cache[0xd] = iVar5 + 2;
      *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar5 + 3,iVar5 + -3);
    }
  }
  uVar3 = (1L << ((byte)iVar47 & 0x3f)) - 0x10;
  uVar22 = lVar48 + position;
  lVar18 = sVar8 + 1;
  local_c0 = commands;
LAB_01e31dde:
LAB_01e31dec:
  uVar35 = position;
  if (uVar1 <= uVar35 + 4) {
    *last_insert_len = (uVar37 + uVar1) - uVar35;
    *num_commands = *num_commands + ((long)local_c0 - (long)commands >> 4);
    return;
  }
  uVar45 = uVar3;
  if (uVar35 < uVar3) {
    uVar45 = uVar35;
  }
  uVar32 = sVar7 + uVar35;
  if (uVar3 <= sVar7 + uVar35) {
    uVar32 = uVar3;
  }
  if ((params->dictionary).contextual.context_based == 0) {
    local_ec = 0;
    local_a0 = 0;
    goto LAB_01e31e95;
  }
  if (uVar35 == 0) {
    local_a0 = 0;
LAB_01e31e65:
    uVar21 = 0;
  }
  else {
    local_a0 = (ulong)ringbuffer[uVar35 - 1 & ringbuffer_mask];
    if (uVar35 == 1) goto LAB_01e31e65;
    uVar21 = (ulong)ringbuffer[uVar35 - 2 & ringbuffer_mask];
  }
  local_ec = (uint)(params->dictionary).contextual.context_map
                   [literal_context_lut[uVar21 + 0x100] | literal_context_lut[local_a0]];
LAB_01e31e95:
  local_128 = uVar1 - uVar35;
  pBVar9 = (params->dictionary).contextual.dict[local_ec];
  uVar21 = (params->dist).max_distance;
  puVar10 = (hasher->privat)._H5.num_;
  puVar11 = (hasher->privat)._H5.buckets_;
  uVar19 = uVar35 & ringbuffer_mask;
  puVar20 = (ulong *)(ringbuffer + uVar19);
  uVar51 = 0x7e4;
  uVar43 = 0;
  uVar44 = 0;
  uVar36 = 0;
  uVar42 = 0;
  do {
    if (uVar36 == (long)(hasher->privat)._H5.num_last_distances_to_check_) {
      uVar41 = (uint)((int)*puVar20 * 0x1e35a7bd) >>
               (*(byte *)((long)&hasher->privat + 0x10) & 0x1f);
      uVar17 = uVar41 << (*(byte *)((long)&hasher->privat + 0x18) & 0x1f);
      uVar4 = puVar10[uVar41];
      uVar38 = (ulong)uVar4;
      uVar36 = (hasher->privat)._H5.block_size_;
      uVar33 = 0;
      if (uVar36 <= uVar38) {
        uVar33 = uVar38 - uVar36;
      }
      uVar29 = (hasher->privat)._H5.block_mask_;
      do {
        local_168 = uVar51;
        uVar28 = uVar42;
        uVar34 = uVar44;
        local_148 = uVar43;
        uVar25 = uVar28 + uVar19;
        do {
          do {
            do {
              do {
                if (uVar38 <= uVar33) {
LAB_01e32171:
                  puVar11[(ulong)uVar17 + (ulong)(uVar29 & uVar4)] = (uint32_t)uVar35;
                  puVar10[uVar41] = uVar4 + 1;
                  if (local_168 != 0x7e4) {
                    iVar47 = 0;
                    goto LAB_01e3241b;
                  }
                  pHVar12 = (hasher->privat)._H5.common_;
                  uVar45 = pHVar12->dict_num_lookups;
                  local_130 = pHVar12->dict_num_matches;
                  if (local_130 < uVar45 >> 7) goto LAB_01e32427;
                  uVar43 = (ulong)((uint)((int)*puVar20 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                  puVar13 = pBVar9->hash_table_lengths;
                  iVar47 = 0;
                  local_168 = 0x7e4;
                  lVar49 = 0;
                  goto LAB_01e32232;
                }
                uVar38 = uVar38 - 1;
                uVar43 = uVar35 - puVar11[(ulong)uVar17 + (ulong)((uint)uVar38 & uVar29)];
                if (uVar45 < uVar43) goto LAB_01e32171;
              } while (ringbuffer_mask < uVar25);
              uVar42 = (ulong)(puVar11[(ulong)uVar17 + (ulong)((uint)uVar38 & uVar29)] &
                              (uint)ringbuffer_mask);
              uVar44 = uVar42 + uVar28;
            } while ((ringbuffer_mask < uVar44) || (ringbuffer[uVar25] != ringbuffer[uVar44]));
            puVar26 = (ulong *)(ringbuffer + uVar42);
            lVar49 = 0;
            uVar42 = local_128;
            puVar39 = puVar20;
LAB_01e320f4:
            if (uVar42 < 8) {
              for (uVar44 = 0;
                  (uVar42 != uVar44 &&
                  (*(char *)((long)puVar26 + uVar44) == *(char *)((long)puVar39 + uVar44)));
                  uVar44 = uVar44 + 1) {
              }
            }
            else {
              if (*puVar39 == *puVar26) goto code_r0x01e32105;
              uVar42 = *puVar26 ^ *puVar39;
              uVar44 = 0;
              if (uVar42 != 0) {
                for (; (uVar42 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                }
              }
              uVar44 = uVar44 >> 3 & 0x1fffffff;
            }
            uVar44 = uVar44 - lVar49;
          } while (uVar44 < 4);
          iVar47 = 0x1f;
          if ((uint)uVar43 != 0) {
            for (; (uint)uVar43 >> iVar47 == 0; iVar47 = iVar47 + -1) {
            }
          }
          uVar51 = (ulong)(iVar47 * -0x1e + 0x780) + uVar44 * 0x87;
          uVar42 = uVar44;
        } while (uVar51 <= local_168);
      } while( true );
    }
    uVar33 = (ulong)dist_cache[uVar36];
    if (((uVar33 <= uVar45) && (uVar35 - uVar33 < uVar35)) && (uVar42 + uVar19 <= ringbuffer_mask))
    {
      uVar25 = uVar35 - uVar33 & ringbuffer_mask;
      uVar38 = uVar25 + uVar42;
      if ((uVar38 <= ringbuffer_mask) && (ringbuffer[uVar42 + uVar19] == ringbuffer[uVar38])) {
        puVar26 = (ulong *)(ringbuffer + uVar25);
        lVar49 = 0;
        uVar38 = local_128;
        puVar39 = puVar20;
LAB_01e31f50:
        if (uVar38 < 8) {
          for (uVar25 = 0;
              (uVar38 != uVar25 &&
              (*(char *)((long)puVar26 + uVar25) == *(char *)((long)puVar39 + uVar25)));
              uVar25 = uVar25 + 1) {
          }
        }
        else {
          if (*puVar39 == *puVar26) goto code_r0x01e31f61;
          uVar25 = *puVar26 ^ *puVar39;
          uVar38 = 0;
          if (uVar25 != 0) {
            for (; (uVar25 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
            }
          }
          uVar25 = uVar38 >> 3 & 0x1fffffff;
        }
        uVar25 = uVar25 - lVar49;
        if (((2 < uVar25) || ((uVar36 < 2 && (uVar25 == 2)))) &&
           (uVar38 = uVar25 * 0x87 + 0x78f, uVar51 < uVar38)) {
          if (uVar36 != 0) {
            uVar38 = uVar38 - ((0x1ca10U >> ((byte)uVar36 & 0xe) & 0xe) + 0x27);
          }
          if (uVar51 < uVar38) {
            uVar43 = uVar33;
            uVar44 = uVar25;
            uVar42 = uVar25;
            uVar51 = uVar38;
          }
        }
      }
    }
    uVar36 = uVar36 + 1;
  } while( true );
LAB_01e32232:
  if (lVar49 == 2) goto LAB_01e3241b;
  uVar45 = uVar45 + 1;
  pHVar12->dict_num_lookups = uVar45;
  bVar23 = puVar13[uVar43];
  uVar44 = (ulong)bVar23;
  if ((uVar44 != 0) && (uVar44 <= local_128)) {
    pBVar14 = pBVar9->words;
    puVar26 = (ulong *)(pBVar14->data +
                       (ulong)pBVar14->offsets_by_length[uVar44] +
                       pBVar9->hash_table_words[uVar43] * uVar44);
    lVar27 = 0;
    uVar42 = uVar44;
    puVar39 = puVar20;
LAB_01e3229d:
    if (uVar42 < 8) {
      for (uVar42 = 0;
          ((bVar23 & 7) != uVar42 &&
          (*(char *)((long)puVar39 + uVar42) == *(char *)((long)puVar26 + uVar42)));
          uVar42 = uVar42 + 1) {
      }
    }
    else {
      if (*puVar26 == *puVar39) goto code_r0x01e322af;
      uVar51 = *puVar39 ^ *puVar26;
      uVar42 = 0;
      if (uVar51 != 0) {
        for (; (uVar51 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
        }
      }
      uVar42 = uVar42 >> 3 & 0x1fffffff;
    }
    uVar42 = uVar42 - lVar27;
    if (((uVar42 != 0) && (uVar44 < pBVar9->cutoffTransformsCount + uVar42)) &&
       (uVar44 = (ulong)pBVar9->hash_table_words[uVar43] + uVar32 + lVar18 +
                 ((ulong)((uint)(pBVar9->cutoffTransforms >>
                                ((char)(uVar44 - uVar42) * '\x06' & 0x3fU)) & 0x3f) +
                  (uVar44 - uVar42) * 4 << (pBVar14->size_bits_by_length[uVar44] & 0x3f)),
       uVar44 <= uVar21)) {
      iVar5 = 0x1f;
      if ((uint)uVar44 != 0) {
        for (; (uint)uVar44 >> iVar5 == 0; iVar5 = iVar5 + -1) {
        }
      }
      uVar51 = (uVar42 * 0x87 - (ulong)(uint)(iVar5 * 0x1e)) + 0x780;
      if (local_168 <= uVar51) {
        iVar47 = (uint)bVar23 - (int)uVar42;
        local_130 = local_130 + 1;
        pHVar12->dict_num_matches = local_130;
        local_168 = uVar51;
        uVar34 = uVar42;
        local_148 = uVar44;
      }
    }
  }
  lVar49 = lVar49 + 1;
  uVar43 = uVar43 + 1;
  goto LAB_01e32232;
LAB_01e3241b:
  if (local_168 < 0x7e5) {
LAB_01e32427:
    uVar37 = uVar37 + 1;
    position = uVar35 + 1;
    if (uVar22 < position) {
      if (uVar22 + (uint)((int)lVar48 * 4) < position) {
        uVar45 = uVar35 + 0x11;
        if (uVar1 - 4 <= uVar35 + 0x11) {
          uVar45 = uVar1 - 4;
        }
        for (; position < uVar45; position = position + 4) {
          uVar17 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                   (*(byte *)((long)&hasher->privat + 0x10) & 0x1f);
          uVar4 = puVar10[uVar17];
          puVar11[(ulong)((hasher->privat)._H5.block_mask_ & (uint)uVar4) +
                  (ulong)(uVar17 << (*(byte *)((long)&hasher->privat + 0x18) & 0x1f))] =
               (uint32_t)position;
          puVar10[uVar17] = uVar4 + 1;
          uVar37 = uVar37 + 4;
        }
      }
      else {
        uVar45 = uVar35 + 9;
        if (uVar2 <= uVar35 + 9) {
          uVar45 = uVar2;
        }
        for (; position < uVar45; position = position + 2) {
          uVar17 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                   (*(byte *)((long)&hasher->privat + 0x10) & 0x1f);
          uVar4 = puVar10[uVar17];
          puVar11[(ulong)((hasher->privat)._H5.block_mask_ & (uint)uVar4) +
                  (ulong)(uVar17 << (*(byte *)((long)&hasher->privat + 0x18) & 0x1f))] =
               (uint32_t)position;
          puVar10[uVar17] = uVar4 + 1;
          uVar37 = uVar37 + 2;
        }
      }
    }
    goto LAB_01e31dec;
  }
  iVar5 = (hasher->privat)._H5.num_last_distances_to_check_;
  uVar30 = (hasher->privat)._H35.hb.state;
  uVar17 = (hasher->privat)._H5.block_mask_;
  uVar6 = (hasher->privat)._H6.block_mask_;
  local_f0 = 0;
  uVar22 = uVar37;
LAB_01e32548:
  local_128 = local_128 - 1;
  uVar45 = uVar34 - 1;
  if (local_128 <= uVar34 - 1) {
    uVar45 = local_128;
  }
  if (4 < params->quality) {
    uVar45 = 0;
  }
  uVar32 = uVar35 + 1;
  uVar43 = uVar3;
  if (uVar32 < uVar3) {
    uVar43 = uVar32;
  }
  local_b8 = sVar7 + uVar35 + 1;
  if (uVar3 <= local_b8) {
    local_b8 = uVar3;
  }
  if ((params->dictionary).contextual.context_based != 0) {
    local_ec = (uint)(params->dictionary).contextual.context_map
                     [literal_context_lut[local_a0 + 0x100] |
                      literal_context_lut[ringbuffer[uVar35 & ringbuffer_mask]]];
    local_a0 = (ulong)ringbuffer[uVar35 & ringbuffer_mask];
  }
  pBVar9 = (params->dictionary).contextual.dict[local_ec];
  uVar19 = uVar32 & ringbuffer_mask;
  puVar20 = (ulong *)(ringbuffer + uVar19);
  uVar51 = 0x7e4;
  uVar42 = 0;
  uVar44 = 0;
  uVar33 = 0;
  do {
    if (uVar33 == (long)iVar5) {
      uVar29 = (uint)((int)*puVar20 * 0x1e35a7bd) >> ((byte)uVar30 & 0x1f);
      uVar41 = uVar29 << ((byte)uVar6 & 0x1f);
      uVar4 = puVar10[uVar29];
      uVar38 = (ulong)uVar4;
      uVar33 = 0;
      if (uVar36 <= uVar38) {
        uVar33 = uVar38 - uVar36;
      }
      do {
        uVar28 = uVar51;
        local_178 = uVar42;
        uVar46 = uVar45;
        local_180 = uVar44;
        uVar25 = uVar46 + uVar19;
        do {
          do {
            do {
              do {
                if (uVar38 <= uVar33) {
LAB_01e3288c:
                  puVar11[(ulong)uVar41 + (ulong)(uVar17 & uVar4)] = (uint32_t)uVar32;
                  puVar10[uVar29] = uVar4 + 1;
                  iVar50 = 0;
                  if (uVar28 != 0x7e4) goto LAB_01e32b38;
                  pHVar12 = (hasher->privat)._H5.common_;
                  uVar45 = pHVar12->dict_num_lookups;
                  local_e8 = pHVar12->dict_num_matches;
                  uVar28 = 0x7e4;
                  if (local_e8 < uVar45 >> 7) goto LAB_01e32b38;
                  uVar43 = (ulong)((uint)((int)*puVar20 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                  puVar13 = pBVar9->hash_table_lengths;
                  iVar50 = 0;
                  lVar49 = 0;
                  goto LAB_01e32979;
                }
                uVar38 = uVar38 - 1;
                uVar42 = uVar32 - puVar11[(ulong)uVar41 + (ulong)((uint)uVar38 & uVar17)];
                if (uVar43 < uVar42) goto LAB_01e3288c;
              } while (ringbuffer_mask < uVar25);
              uVar44 = (ulong)(puVar11[(ulong)uVar41 + (ulong)((uint)uVar38 & uVar17)] &
                              (uint)ringbuffer_mask);
              uVar45 = uVar44 + uVar46;
            } while ((ringbuffer_mask < uVar45) || (ringbuffer[uVar25] != ringbuffer[uVar45]));
            puVar26 = (ulong *)(ringbuffer + uVar44);
            lVar49 = 0;
            uVar45 = local_128;
            puVar39 = puVar20;
LAB_01e32809:
            if (uVar45 < 8) {
              for (uVar44 = 0;
                  (uVar45 != uVar44 &&
                  (*(char *)((long)puVar26 + uVar44) == *(char *)((long)puVar39 + uVar44)));
                  uVar44 = uVar44 + 1) {
              }
            }
            else {
              if (*puVar39 == *puVar26) goto code_r0x01e3281a;
              uVar44 = *puVar26 ^ *puVar39;
              uVar45 = 0;
              if (uVar44 != 0) {
                for (; (uVar44 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                }
              }
              uVar44 = uVar45 >> 3 & 0x1fffffff;
            }
            uVar44 = uVar44 - lVar49;
          } while (uVar44 < 4);
          iVar50 = 0x1f;
          if ((uint)uVar42 != 0) {
            for (; (uint)uVar42 >> iVar50 == 0; iVar50 = iVar50 + -1) {
            }
          }
          uVar51 = (ulong)(iVar50 * -0x1e + 0x780) + uVar44 * 0x87;
          uVar45 = uVar44;
        } while (uVar51 <= uVar28);
      } while( true );
    }
    uVar38 = (ulong)dist_cache[uVar33];
    if (((uVar38 <= uVar43) && (uVar32 - uVar38 < uVar32)) && (uVar45 + uVar19 <= ringbuffer_mask))
    {
      uVar28 = uVar32 - uVar38 & ringbuffer_mask;
      uVar25 = uVar28 + uVar45;
      if ((uVar25 <= ringbuffer_mask) && (ringbuffer[uVar45 + uVar19] == ringbuffer[uVar25])) {
        puVar26 = (ulong *)(ringbuffer + uVar28);
        lVar49 = 0;
        puVar39 = puVar20;
        uVar25 = local_128;
LAB_01e32674:
        if (uVar25 < 8) {
          for (uVar28 = 0;
              (uVar25 != uVar28 &&
              (*(char *)((long)puVar26 + uVar28) == *(char *)((long)puVar39 + uVar28)));
              uVar28 = uVar28 + 1) {
          }
        }
        else {
          if (*puVar39 == *puVar26) goto code_r0x01e32686;
          uVar28 = *puVar26 ^ *puVar39;
          uVar25 = 0;
          if (uVar28 != 0) {
            for (; (uVar28 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
            }
          }
          uVar28 = uVar25 >> 3 & 0x1fffffff;
        }
        uVar28 = uVar28 - lVar49;
        if (((2 < uVar28) || ((uVar33 < 2 && (uVar28 == 2)))) &&
           (uVar25 = uVar28 * 0x87 + 0x78f, uVar51 < uVar25)) {
          if (uVar33 != 0) {
            uVar25 = uVar25 - ((0x1ca10U >> ((byte)uVar33 & 0xe) & 0xe) + 0x27);
          }
          if (uVar51 < uVar25) {
            uVar44 = uVar28;
            uVar45 = uVar28;
            uVar42 = uVar38;
            uVar51 = uVar25;
          }
        }
      }
    }
    uVar33 = uVar33 + 1;
  } while( true );
LAB_01e32979:
  if (lVar49 == 2) goto LAB_01e32b38;
  uVar45 = uVar45 + 1;
  pHVar12->dict_num_lookups = uVar45;
  bVar23 = puVar13[uVar43];
  uVar44 = (ulong)bVar23;
  if ((uVar44 != 0) && (uVar44 <= local_128)) {
    pBVar14 = pBVar9->words;
    puVar26 = (ulong *)(pBVar14->data +
                       (ulong)pBVar14->offsets_by_length[uVar44] +
                       pBVar9->hash_table_words[uVar43] * uVar44);
    lVar27 = 0;
    uVar42 = uVar44;
    puVar39 = puVar20;
LAB_01e329fb:
    if (uVar42 < 8) {
      for (uVar42 = 0;
          ((bVar23 & 7) != uVar42 &&
          (*(char *)((long)puVar39 + uVar42) == *(char *)((long)puVar26 + uVar42)));
          uVar42 = uVar42 + 1) {
      }
    }
    else {
      if (*puVar26 == *puVar39) goto code_r0x01e32a0d;
      uVar51 = *puVar39 ^ *puVar26;
      uVar42 = 0;
      if (uVar51 != 0) {
        for (; (uVar51 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
        }
      }
      uVar42 = uVar42 >> 3 & 0x1fffffff;
    }
    uVar42 = uVar42 - lVar27;
    if (((uVar42 != 0) && (uVar44 < pBVar9->cutoffTransformsCount + uVar42)) &&
       (uVar44 = (ulong)pBVar9->hash_table_words[uVar43] + lVar18 + local_b8 +
                 ((ulong)((uint)(pBVar9->cutoffTransforms >>
                                ((char)(uVar44 - uVar42) * '\x06' & 0x3fU)) & 0x3f) +
                  (uVar44 - uVar42) * 4 << (pBVar14->size_bits_by_length[uVar44] & 0x3f)),
       uVar44 <= uVar21)) {
      iVar16 = 0x1f;
      if ((uint)uVar44 != 0) {
        for (; (uint)uVar44 >> iVar16 == 0; iVar16 = iVar16 + -1) {
        }
      }
      uVar51 = (uVar42 * 0x87 - (ulong)(uint)(iVar16 * 0x1e)) + 0x780;
      if (uVar28 <= uVar51) {
        iVar50 = (uint)bVar23 - (int)uVar42;
        local_e8 = local_e8 + 1;
        pHVar12->dict_num_matches = local_e8;
        uVar28 = uVar51;
        local_180 = uVar42;
        local_178 = uVar44;
      }
    }
  }
  lVar49 = lVar49 + 1;
  uVar43 = uVar43 + 1;
  goto LAB_01e32979;
LAB_01e32b38:
  if (uVar28 < local_168 + 0xaf) {
    uVar45 = uVar22;
    local_180 = uVar34;
    uVar32 = uVar35;
    iVar50 = iVar47;
    local_b8 = uVar35 + sVar7;
    if (uVar3 <= uVar35 + sVar7) {
      local_b8 = uVar3;
    }
    goto LAB_01e32bd1;
  }
  uVar45 = uVar37 + 4;
  local_148 = local_178;
  if (local_f0 == 3) goto LAB_01e32bd1;
  uVar45 = uVar22 + 1;
  local_f0 = local_f0 + 1;
  uVar43 = uVar35 + 5;
  uVar22 = uVar45;
  uVar34 = local_180;
  uVar35 = uVar32;
  local_168 = uVar28;
  iVar47 = iVar50;
  if (uVar1 <= uVar43) goto LAB_01e32bd1;
  goto LAB_01e32548;
LAB_01e32bd1:
  local_b8 = local_b8 + sVar8;
  if (local_b8 < local_148) {
LAB_01e32c04:
    uVar37 = local_148 + 0xf;
  }
  else {
    if (local_148 == (long)*dist_cache) {
      uVar37 = 0;
      goto LAB_01e32cab;
    }
    uVar37 = 1;
    if (local_148 != (long)dist_cache[1]) {
      uVar37 = (local_148 + 3) - (long)*dist_cache;
      if (uVar37 < 7) {
        bVar23 = (byte)((int)uVar37 << 2);
        uVar17 = 0x9750468;
      }
      else {
        uVar37 = (local_148 + 3) - (long)dist_cache[1];
        if (6 < uVar37) {
          uVar37 = 2;
          if ((local_148 != (long)dist_cache[2]) && (uVar37 = 3, local_148 != (long)dist_cache[3]))
          goto LAB_01e32c04;
          goto LAB_01e32c08;
        }
        bVar23 = (byte)((int)uVar37 << 2);
        uVar17 = 0xfdb1ace;
      }
      uVar37 = (ulong)(uVar17 >> (bVar23 & 0x1f) & 0xf);
    }
  }
LAB_01e32c08:
  if ((local_148 <= local_b8) && (uVar37 != 0)) {
    dist_cache[3] = dist_cache[2];
    uVar15 = *(undefined8 *)dist_cache;
    *(undefined8 *)(dist_cache + 1) = uVar15;
    iVar47 = (int)local_148;
    *dist_cache = iVar47;
    uVar17 = *(uint *)((long)&(hasher->privat)._H35.hb.table + 4);
    if (4 < (int)uVar17) {
      dist_cache[4] = iVar47 + -1;
      dist_cache[5] = iVar47 + 1;
      dist_cache[6] = iVar47 + -2;
      dist_cache[7] = iVar47 + 2;
      dist_cache[8] = iVar47 + -3;
      dist_cache[9] = iVar47 + 3;
      if (10 < uVar17) {
        iVar47 = (int)uVar15;
        dist_cache[10] = iVar47 + -1;
        dist_cache[0xb] = iVar47 + 1;
        dist_cache[0xc] = iVar47 + -2;
        dist_cache[0xd] = iVar47 + 2;
        *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar47 + 3,iVar47 + -3);
      }
    }
  }
LAB_01e32cab:
  uVar17 = (uint)uVar45;
  local_c0->insert_len_ = uVar17;
  local_c0->copy_len_ = iVar50 << 0x19 | (uint)local_180;
  uVar35 = (ulong)(params->dist).num_direct_distance_codes;
  uVar22 = uVar35 + 0x10;
  uVar30 = 0;
  if (uVar22 <= uVar37) {
    uVar41 = (params->dist).distance_postfix_bits;
    bVar23 = (byte)uVar41;
    uVar35 = ((uVar37 - uVar35) + (4L << (bVar23 & 0x3f))) - 0x10;
    uVar29 = 0x1f;
    uVar31 = (uint)uVar35;
    if (uVar31 != 0) {
      for (; uVar31 >> uVar29 == 0; uVar29 = uVar29 - 1) {
      }
    }
    uVar29 = (uVar29 ^ 0xffffffe0) + 0x1f;
    uVar21 = (ulong)((uVar35 >> ((ulong)uVar29 & 0x3f) & 1) != 0);
    lVar49 = (ulong)uVar29 - (ulong)uVar41;
    uVar37 = (~(-1 << (bVar23 & 0x1f)) & uVar31) + uVar22 +
             (uVar21 + lVar49 * 2 + 0xfffe << (bVar23 & 0x3f)) | lVar49 * 0x400;
    uVar30 = (uint32_t)(uVar35 - (uVar21 + 2 << ((byte)uVar29 & 0x3f)) >> (bVar23 & 0x3f));
  }
  local_c0->dist_prefix_ = (uint16_t)uVar37;
  local_c0->dist_extra_ = uVar30;
  if (5 < uVar45) {
    if (uVar45 < 0x82) {
      uVar17 = 0x1f;
      uVar41 = (uint)(uVar45 - 2);
      if (uVar41 != 0) {
        for (; uVar41 >> uVar17 == 0; uVar17 = uVar17 - 1) {
        }
      }
      uVar17 = (int)(uVar45 - 2 >> ((char)(uVar17 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar17 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (uVar45 < 0x842) {
      uVar41 = 0x1f;
      if (uVar17 - 0x42 != 0) {
        for (; uVar17 - 0x42 >> uVar41 == 0; uVar41 = uVar41 - 1) {
        }
      }
      uVar17 = (uVar41 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar17 = 0x15;
      if (0x1841 < uVar45) {
        uVar17 = (uint)(ushort)(0x17 - (uVar45 < 0x5842));
      }
    }
  }
  uVar41 = iVar50 + (uint)local_180;
  if (uVar41 < 10) {
    uVar29 = uVar41 - 2;
  }
  else if (uVar41 < 0x86) {
    uVar41 = uVar41 - 6;
    uVar29 = 0x1f;
    if (uVar41 != 0) {
      for (; uVar41 >> uVar29 == 0; uVar29 = uVar29 - 1) {
      }
    }
    uVar29 = (uVar41 >> ((char)(uVar29 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar29 ^ 0xffffffe0) * 2 +
             0x42;
  }
  else {
    uVar29 = 0x17;
    if (uVar41 < 0x846) {
      uVar29 = 0x1f;
      if (uVar41 - 0x46 != 0) {
        for (; uVar41 - 0x46 >> uVar29 == 0; uVar29 = uVar29 - 1) {
        }
      }
      uVar29 = (uVar29 ^ 0xffe0) + 0x2c;
    }
  }
  uVar4 = (ushort)uVar29;
  uVar40 = (uVar4 & 7) + ((ushort)uVar17 & 7) * 8;
  if ((((uVar37 & 0x3ff) == 0) && ((ushort)uVar17 < 8)) && (uVar4 < 0x10)) {
    if (7 < uVar4) {
      uVar40 = uVar40 + 0x40;
    }
  }
  else {
    iVar47 = ((uVar17 & 0xffff) >> 3) * 3 + ((uVar29 & 0xffff) >> 3);
    uVar40 = uVar40 + ((ushort)(0x520d40 >> ((char)iVar47 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar47 * 0x40 + 0x40;
  }
  local_c0->cmd_prefix_ = uVar40;
  *num_literals = *num_literals + uVar45;
  position = local_180 + uVar32;
  uVar37 = sVar24;
  if (position < sVar24) {
    uVar37 = position;
  }
  uVar35 = uVar32 + 2;
  if (local_148 < local_180 >> 2) {
    uVar22 = position + local_148 * -4;
    if (uVar22 < uVar35) {
      uVar22 = uVar35;
    }
    uVar35 = uVar22;
    if (uVar37 < uVar22) {
      uVar35 = uVar37;
    }
  }
  uVar22 = uVar32 + lVar48 + local_180 * 2;
  local_c0 = local_c0 + 1;
  for (; uVar35 < uVar37; uVar35 = uVar35 + 1) {
    uVar17 = (uint)(*(int *)(ringbuffer + (uVar35 & ringbuffer_mask)) * 0x1e35a7bd) >>
             (*(byte *)((long)&hasher->privat + 0x10) & 0x1f);
    uVar4 = puVar10[uVar17];
    puVar11[(ulong)((hasher->privat)._H5.block_mask_ & (uint)uVar4) +
            (ulong)(uVar17 << (*(byte *)((long)&hasher->privat + 0x18) & 0x1f))] = (uint32_t)uVar35;
    puVar10[uVar17] = uVar4 + 1;
  }
  uVar37 = 0;
  goto LAB_01e31dde;
code_r0x01e32a0d:
  puVar26 = puVar26 + 1;
  puVar39 = puVar39 + 1;
  uVar42 = uVar42 - 8;
  lVar27 = lVar27 + -8;
  goto LAB_01e329fb;
code_r0x01e3281a:
  puVar39 = puVar39 + 1;
  puVar26 = puVar26 + 1;
  uVar45 = uVar45 - 8;
  lVar49 = lVar49 + -8;
  goto LAB_01e32809;
code_r0x01e32686:
  puVar39 = puVar39 + 1;
  puVar26 = puVar26 + 1;
  uVar25 = uVar25 - 8;
  lVar49 = lVar49 + -8;
  goto LAB_01e32674;
code_r0x01e322af:
  puVar26 = puVar26 + 1;
  puVar39 = puVar39 + 1;
  uVar42 = uVar42 - 8;
  lVar27 = lVar27 + -8;
  goto LAB_01e3229d;
code_r0x01e32105:
  puVar39 = puVar39 + 1;
  puVar26 = puVar26 + 1;
  uVar42 = uVar42 - 8;
  lVar49 = lVar49 + -8;
  goto LAB_01e320f4;
code_r0x01e31f61:
  puVar39 = puVar39 + 1;
  puVar26 = puVar26 + 1;
  uVar38 = uVar38 - 8;
  lVar49 = lVar49 + -8;
  goto LAB_01e31f50;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}